

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptFields.cpp
# Opt level: O2

bool __thiscall
GlobOpt::HasLiveObjectHeaderInlinedTypeSym
          (GlobOpt *this,BasicBlock *block,bool isObjTypeSpecialized,SymID opndId)

{
  int iVar1;
  EquivalentTypeSet *this_00;
  long lVar2;
  code *pcVar3;
  bool bVar4;
  TypeId TVar5;
  undefined4 *puVar6;
  Value *pVVar7;
  JsTypeValueInfo *pJVar8;
  JITType *pJVar9;
  JITTypeHandler *pJVar10;
  undefined7 in_register_00000011;
  uint16 i;
  uint16 index;
  SymID typeSymId;
  anon_class_8_1_8991fb9c local_60;
  BVUnitT<unsigned_long> local_58;
  SparseBVUnit _unit;
  JITTypeHolderBase<void> local_40;
  JITTypeHolder type;
  
  _unit.word = (Type)this->objectTypeSyms;
  if ((BVSparse<Memory::JitArenaAllocator> *)_unit.word !=
      (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    local_60.this = this;
    puVar6 = (undefined4 *)
             __tls_get_addr(&PTR_013e5f18,&block->globOptData,
                            CONCAT71(in_register_00000011,isObjTypeSpecialized));
    while (_unit.word = *_unit.word, _unit.word != 0) {
      iVar1 = *(int *)(_unit.word + 8);
      local_58.word = *(ulong *)(_unit.word + 0x10);
      while (local_58.word != 0) {
        lVar2 = 0;
        if (local_58.word != 0) {
          for (; (local_58.word >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
          }
        }
        typeSymId = iVar1 + (BVIndex)lVar2;
        BVUnitT<unsigned_long>::Clear(&local_58,(BVIndex)lVar2);
        if ((typeSymId != opndId) &&
           (pVVar7 = GlobOptBlockData::FindObjectTypeValue(&block->globOptData,typeSymId),
           pVVar7 != (Value *)0x0)) {
          pJVar8 = ValueInfo::AsJsType(pVVar7->valueInfo);
          if (pJVar8 == (JsTypeValueInfo *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar6 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                               ,0x3f7,"(valueInfo)","valueInfo");
            if (!bVar4) {
              pcVar3 = (code *)invalidInstructionException();
              (*pcVar3)();
            }
            *puVar6 = 0;
          }
          local_40.t = (pJVar8->jsType).t;
          type.t = (Type)0x0;
          bVar4 = JITTypeHolderBase<void>::operator!=(&local_40,&type.t);
          if (bVar4) {
            local_40.t = (pJVar8->jsType).t;
            pJVar9 = JITTypeHolderBase<void>::operator->(&local_40);
            TVar5 = JITType::GetTypeId(pJVar9);
            bVar4 = Js::DynamicType::Is(TVar5);
            if (bVar4) {
              pJVar9 = JITTypeHolderBase<void>::operator->(&local_40);
              pJVar10 = JITType::GetTypeHandler(pJVar9);
              bVar4 = JITTypeHandler::IsObjectHeaderInlinedTypeHandler(pJVar10);
              if (bVar4) {
LAB_0046c19c:
                bVar4 = HasLiveObjectHeaderInlinedTypeSym::anon_class_8_1_8991fb9c::operator()
                                  (&local_60,typeSymId);
                if (bVar4) {
                  return true;
                }
              }
            }
          }
          else {
            this_00 = pJVar8->jsTypeSet;
            if (this_00 != (EquivalentTypeSet *)0x0) {
              for (index = 0; index < this_00->count; index = index + 1) {
                local_40.t = (Type)Js::EquivalentTypeSet::GetType(this_00,index);
                type.t = (Type)0x0;
                bVar4 = JITTypeHolderBase<void>::operator!=(&local_40,&type.t);
                if (bVar4) {
                  pJVar9 = JITTypeHolderBase<void>::operator->(&local_40);
                  TVar5 = JITType::GetTypeId(pJVar9);
                  bVar4 = Js::DynamicType::Is(TVar5);
                  if (bVar4) {
                    pJVar9 = JITTypeHolderBase<void>::operator->(&local_40);
                    pJVar10 = JITType::GetTypeHandler(pJVar9);
                    bVar4 = JITTypeHandler::IsObjectHeaderInlinedTypeHandler(pJVar10);
                    if (bVar4) goto LAB_0046c19c;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool
GlobOpt::HasLiveObjectHeaderInlinedTypeSym(BasicBlock *block, bool isObjTypeSpecialized, SymID opndId)
{
    return this->MapObjectHeaderInlinedTypeSymsUntil(block, true, opndId, [&](SymID symId)->bool { return this->currentBlock->globOptData.liveFields->Test(symId); });
}